

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileAPI.cxx
# Opt level: O3

ClientRequests * __thiscall
cmFileAPI::BuildClientRequests
          (ClientRequests *__return_storage_ptr__,cmFileAPI *this,Value *requests)

{
  bool bVar1;
  ArrayIndex AVar2;
  Value *request;
  char *pcVar3;
  const_iterator cVar4;
  ValueIteratorBase local_80;
  ClientRequest local_70;
  SelfType local_40;
  
  (__return_storage_ptr__->
  super_vector<cmFileAPI::ClientRequest,_std::allocator<cmFileAPI::ClientRequest>_>).
  super__Vector_base<cmFileAPI::ClientRequest,_std::allocator<cmFileAPI::ClientRequest>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super_vector<cmFileAPI::ClientRequest,_std::allocator<cmFileAPI::ClientRequest>_>).
  super__Vector_base<cmFileAPI::ClientRequest,_std::allocator<cmFileAPI::ClientRequest>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super_vector<cmFileAPI::ClientRequest,_std::allocator<cmFileAPI::ClientRequest>_>).
  super__Vector_base<cmFileAPI::ClientRequest,_std::allocator<cmFileAPI::ClientRequest>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->Error)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->Error).field_2;
  (__return_storage_ptr__->Error)._M_string_length = 0;
  (__return_storage_ptr__->Error).field_2._M_local_buf[0] = '\0';
  bVar1 = Json::Value::isNull(requests);
  if (bVar1) {
    pcVar3 = "\'requests\' member missing";
  }
  else {
    bVar1 = Json::Value::isArray(requests);
    if (bVar1) {
      AVar2 = Json::Value::size(requests);
      std::vector<cmFileAPI::ClientRequest,_std::allocator<cmFileAPI::ClientRequest>_>::reserve
                (&__return_storage_ptr__->
                  super_vector<cmFileAPI::ClientRequest,_std::allocator<cmFileAPI::ClientRequest>_>,
                 (ulong)AVar2);
      cVar4 = Json::Value::begin(requests);
      local_80.current_ = cVar4.super_ValueIteratorBase.current_._M_node;
      local_80.isNull_ = cVar4.super_ValueIteratorBase.isNull_;
      cVar4 = Json::Value::end(requests);
      local_40.current_ = cVar4.super_ValueIteratorBase.current_._M_node;
      local_40.isNull_ = cVar4.super_ValueIteratorBase.isNull_;
      while (bVar1 = Json::ValueIteratorBase::isEqual(&local_80,&local_40), !bVar1) {
        request = Json::ValueIteratorBase::deref(&local_80);
        BuildClientRequest(&local_70,this,request);
        std::vector<cmFileAPI::ClientRequest,_std::allocator<cmFileAPI::ClientRequest>_>::
        emplace_back<cmFileAPI::ClientRequest>
                  (&__return_storage_ptr__->
                    super_vector<cmFileAPI::ClientRequest,_std::allocator<cmFileAPI::ClientRequest>_>
                   ,&local_70);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70.Error._M_dataplus._M_p != &local_70.Error.field_2) {
          operator_delete(local_70.Error._M_dataplus._M_p,
                          local_70.Error.field_2._M_allocated_capacity + 1);
        }
        Json::ValueIteratorBase::increment(&local_80);
      }
      return __return_storage_ptr__;
    }
    pcVar3 = "\'requests\' member is not an array";
  }
  std::__cxx11::string::_M_replace
            ((ulong)&__return_storage_ptr__->Error,0,
             (char *)(__return_storage_ptr__->Error)._M_string_length,(ulong)pcVar3);
  return __return_storage_ptr__;
}

Assistant:

cmFileAPI::ClientRequests cmFileAPI::BuildClientRequests(
  Json::Value const& requests)
{
  ClientRequests result;
  if (requests.isNull()) {
    result.Error = "'requests' member missing";
    return result;
  }
  if (!requests.isArray()) {
    result.Error = "'requests' member is not an array";
    return result;
  }

  result.reserve(requests.size());
  for (Json::Value const& request : requests) {
    result.emplace_back(this->BuildClientRequest(request));
  }

  return result;
}